

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O1

void chrono::TriangleNormalsSmooth
               (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                *normals,vector<int,_std::allocator<int>_> *accumul)

{
  double dVar1;
  double dVar2;
  pointer pCVar3;
  pointer piVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  pCVar3 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(normals->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3;
  if (lVar7 != 0) {
    uVar6 = (lVar7 >> 3) * -0x5555555555555555;
    piVar4 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = pCVar3->m_data + 2;
    uVar8 = 0;
    do {
      dVar9 = 1.0 / (double)piVar4[uVar8];
      dVar1 = pdVar5[-1];
      dVar2 = *pdVar5;
      ((ChVector<double> *)(pdVar5 + -2))->m_data[0] =
           dVar9 * ((ChVector<double> *)(pdVar5 + -2))->m_data[0];
      pdVar5[-1] = dVar9 * dVar1;
      *pdVar5 = dVar9 * dVar2;
      uVar8 = uVar8 + 1;
      pdVar5 = pdVar5 + 3;
    } while ((uVar8 & 0xffffffff) <= uVar6 && uVar6 - (uVar8 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void TriangleNormalsSmooth(std::vector<ChVector<>>& normals, std::vector<int>& accumul) {
    for (unsigned int nn = 0; nn < normals.size(); ++nn) {
        normals[nn] = normals[nn] * (1.0 / (double)accumul[nn]);
    }
}